

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkStats.h
# Opt level: O0

void Corrade::TestSuite::Implementation::printStats
               (Debug *out,double mean,double stddev,Color color,BenchmarkUnits unit)

{
  undefined8 uVar1;
  EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)__xff_> local_51;
  Error local_50 [40];
  BenchmarkUnits local_28;
  Color local_21;
  BenchmarkUnits unit_local;
  Color color_local;
  double stddev_local;
  double mean_local;
  Debug *out_local;
  
  local_28 = unit;
  local_21 = color;
  _unit_local = stddev;
  stddev_local = mean;
  mean_local = (double)out;
  switch(unit) {
  case Nanoseconds:
    printTime(out,mean,stddev,color);
    break;
  case Cycles:
    printCount(out,mean,stddev,color,1000.0,"C");
    break;
  case Instructions:
    printCount(out,mean,stddev,color,1000.0,"I");
    break;
  case Bytes:
    printCount(out,mean,stddev,color,1024.0,"B");
    break;
  case Count:
    printCount(out,mean,stddev,color,1000.0," ");
    break;
  case RatioThousandths:
    printCount(out,mean / 1000.0,stddev / 1000.0,color,1000.0," ");
    break;
  case PercentageThousandths:
    printCount(out,mean / 1000.0,stddev / 1000.0,color,1000.0,"%");
    break;
  default:
    uVar1 = Corrade::Utility::Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_51);
    Corrade::Utility::Error::Error(local_50,uVar1,local_51._value);
    Corrade::Utility::Debug::operator<<
              ((Debug *)local_50,
               "Reached unreachable code at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/TestSuite/Implementation/BenchmarkStats.h:150"
              );
    Corrade::Utility::Error::~Error(local_50);
    abort();
  }
  return;
}

Assistant:

inline void printStats(Utility::Debug& out, const double mean, const double stddev, const Utility::Debug::Color color, const Tester::BenchmarkUnits unit) {
    switch(unit) {
        case Tester::BenchmarkUnits::Nanoseconds:
            printTime(out, mean, stddev, color);
            return;
        case Tester::BenchmarkUnits::Cycles:
            printCount(out, mean, stddev, color, 1000.0, "C");
            return;
        case Tester::BenchmarkUnits::Instructions:
            printCount(out, mean, stddev, color, 1000.0, "I");
            return;
        case Tester::BenchmarkUnits::Bytes:
            printCount(out, mean, stddev, color, 1024.0, "B");
            return;
        case Tester::BenchmarkUnits::Count:
            printCount(out, mean, stddev, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::RatioThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, " ");
            return;
        case Tester::BenchmarkUnits::PercentageThousandths:
            printCount(out, mean/1000.0, stddev/1000.0, color, 1000.0, "%");
            return;
    }

    CORRADE_INTERNAL_ASSERT_UNREACHABLE(); /* LCOV_EXCL_LINE */
}